

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_cache.cpp
# Opt level: O0

int __thiscall bidfx_public_api::tools::NameCache::LastID(NameCache *this,string *name_prefix)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_50 [3];
  _Self local_38;
  iterator existing;
  unique_lock<std::mutex> lock;
  string *name_prefix_local;
  NameCache *this_local;
  
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)&existing,&this->mutex_);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<int>_>_>_>
       ::find(&this->cache_,name_prefix);
  local_50[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<int>_>_>_>
       ::end(&this->cache_);
  bVar1 = std::operator==(&local_38,local_50);
  if (bVar1) {
    this_local._4_4_ = 0;
  }
  else {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<int>_>_>
             ::operator->(&local_38);
    this_local._4_4_ = std::__atomic_base::operator_cast_to_int((__atomic_base *)&ppVar2->second);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&existing);
  return this_local._4_4_;
}

Assistant:

int NameCache::LastID(const std::string& name_prefix)
{
    std::unique_lock<std::mutex> lock(mutex_);
    auto existing = cache_.find(name_prefix);
    if (existing == cache_.end())
    {
        return 0;
    }
    return existing->second;
}